

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool is_pressed)

{
  X11_static *pXVar1;
  bool is_pressed_local;
  uint keycode_local;
  CImgDisplay *this_local;
  
  if (keycode == 0xff1b) {
    this->_is_keyESC = is_pressed;
  }
  if (keycode == 0xffbe) {
    this->_is_keyF1 = is_pressed;
  }
  if (keycode == 0xffbf) {
    this->_is_keyF2 = is_pressed;
  }
  if (keycode == 0xffc0) {
    this->_is_keyF3 = is_pressed;
  }
  if (keycode == 0xffc1) {
    this->_is_keyF4 = is_pressed;
  }
  if (keycode == 0xffc2) {
    this->_is_keyF5 = is_pressed;
  }
  if (keycode == 0xffc3) {
    this->_is_keyF6 = is_pressed;
  }
  if (keycode == 0xffc4) {
    this->_is_keyF7 = is_pressed;
  }
  if (keycode == 0xffc5) {
    this->_is_keyF8 = is_pressed;
  }
  if (keycode == 0xffc6) {
    this->_is_keyF9 = is_pressed;
  }
  if (keycode == 0xffc7) {
    this->_is_keyF10 = is_pressed;
  }
  if (keycode == 0xffc8) {
    this->_is_keyF11 = is_pressed;
  }
  if (keycode == 0xffc9) {
    this->_is_keyF12 = is_pressed;
  }
  if (keycode == 0xff13) {
    this->_is_keyPAUSE = is_pressed;
  }
  if (keycode == 0x31) {
    this->_is_key1 = is_pressed;
  }
  if (keycode == 0x32) {
    this->_is_key2 = is_pressed;
  }
  if (keycode == 0x33) {
    this->_is_key3 = is_pressed;
  }
  if (keycode == 0x34) {
    this->_is_key4 = is_pressed;
  }
  if (keycode == 0x35) {
    this->_is_key5 = is_pressed;
  }
  if (keycode == 0x36) {
    this->_is_key6 = is_pressed;
  }
  if (keycode == 0x37) {
    this->_is_key7 = is_pressed;
  }
  if (keycode == 0x38) {
    this->_is_key8 = is_pressed;
  }
  if (keycode == 0x39) {
    this->_is_key9 = is_pressed;
  }
  if (keycode == 0x30) {
    this->_is_key0 = is_pressed;
  }
  if (keycode == 0xff08) {
    this->_is_keyBACKSPACE = is_pressed;
  }
  if (keycode == 0xff63) {
    this->_is_keyINSERT = is_pressed;
  }
  if (keycode == 0xff50) {
    this->_is_keyHOME = is_pressed;
  }
  if (keycode == 0xff55) {
    this->_is_keyPAGEUP = is_pressed;
  }
  if (keycode == 0xff09) {
    this->_is_keyTAB = is_pressed;
  }
  if (keycode == 0x71) {
    this->_is_keyQ = is_pressed;
  }
  if (keycode == 0x77) {
    this->_is_keyW = is_pressed;
  }
  if (keycode == 0x65) {
    this->_is_keyE = is_pressed;
  }
  if (keycode == 0x72) {
    this->_is_keyR = is_pressed;
  }
  if (keycode == 0x74) {
    this->_is_keyT = is_pressed;
  }
  if (keycode == 0x79) {
    this->_is_keyY = is_pressed;
  }
  if (keycode == 0x75) {
    this->_is_keyU = is_pressed;
  }
  if (keycode == 0x69) {
    this->_is_keyI = is_pressed;
  }
  if (keycode == 0x6f) {
    this->_is_keyO = is_pressed;
  }
  if (keycode == 0x70) {
    this->_is_keyP = is_pressed;
  }
  if (keycode == 0xffff) {
    this->_is_keyDELETE = is_pressed;
  }
  if (keycode == 0xff57) {
    this->_is_keyEND = is_pressed;
  }
  if (keycode == 0xff56) {
    this->_is_keyPAGEDOWN = is_pressed;
  }
  if (keycode == 0xffe5) {
    this->_is_keyCAPSLOCK = is_pressed;
  }
  if (keycode == 0x61) {
    this->_is_keyA = is_pressed;
  }
  if (keycode == 0x73) {
    this->_is_keyS = is_pressed;
  }
  if (keycode == 100) {
    this->_is_keyD = is_pressed;
  }
  if (keycode == 0x66) {
    this->_is_keyF = is_pressed;
  }
  if (keycode == 0x67) {
    this->_is_keyG = is_pressed;
  }
  if (keycode == 0x68) {
    this->_is_keyH = is_pressed;
  }
  if (keycode == 0x6a) {
    this->_is_keyJ = is_pressed;
  }
  if (keycode == 0x6b) {
    this->_is_keyK = is_pressed;
  }
  if (keycode == 0x6c) {
    this->_is_keyL = is_pressed;
  }
  if (keycode == 0xff0d) {
    this->_is_keyENTER = is_pressed;
  }
  if (keycode == 0xffe1) {
    this->_is_keySHIFTLEFT = is_pressed;
  }
  if (keycode == 0x7a) {
    this->_is_keyZ = is_pressed;
  }
  if (keycode == 0x78) {
    this->_is_keyX = is_pressed;
  }
  if (keycode == 99) {
    this->_is_keyC = is_pressed;
  }
  if (keycode == 0x76) {
    this->_is_keyV = is_pressed;
  }
  if (keycode == 0x62) {
    this->_is_keyB = is_pressed;
  }
  if (keycode == 0x6e) {
    this->_is_keyN = is_pressed;
  }
  if (keycode == 0x6d) {
    this->_is_keyM = is_pressed;
  }
  if (keycode == 0xffe2) {
    this->_is_keySHIFTRIGHT = is_pressed;
  }
  if (keycode == 0xff52) {
    this->_is_keyARROWUP = is_pressed;
  }
  if (keycode == 0xffe3) {
    this->_is_keyCTRLLEFT = is_pressed;
  }
  if (keycode == 0xffeb) {
    this->_is_keyAPPLEFT = is_pressed;
  }
  if (keycode == 0xffe9) {
    this->_is_keyALT = is_pressed;
  }
  if (keycode == 0x20) {
    this->_is_keySPACE = is_pressed;
  }
  if (keycode == 0xffea) {
    this->_is_keyALTGR = is_pressed;
  }
  if (keycode == 0xffec) {
    this->_is_keyAPPRIGHT = is_pressed;
  }
  if (keycode == 0xff67) {
    this->_is_keyMENU = is_pressed;
  }
  if (keycode == 0xffe4) {
    this->_is_keyCTRLRIGHT = is_pressed;
  }
  if (keycode == 0xff51) {
    this->_is_keyARROWLEFT = is_pressed;
  }
  if (keycode == 0xff54) {
    this->_is_keyARROWDOWN = is_pressed;
  }
  if (keycode == 0xff53) {
    this->_is_keyARROWRIGHT = is_pressed;
  }
  if (keycode == 0xffb0) {
    this->_is_keyPAD0 = is_pressed;
  }
  if (keycode == 0xffb1) {
    this->_is_keyPAD1 = is_pressed;
  }
  if (keycode == 0xffb2) {
    this->_is_keyPAD2 = is_pressed;
  }
  if (keycode == 0xffb3) {
    this->_is_keyPAD3 = is_pressed;
  }
  if (keycode == 0xffb4) {
    this->_is_keyPAD4 = is_pressed;
  }
  if (keycode == 0xffb5) {
    this->_is_keyPAD5 = is_pressed;
  }
  if (keycode == 0xffb6) {
    this->_is_keyPAD6 = is_pressed;
  }
  if (keycode == 0xffb7) {
    this->_is_keyPAD7 = is_pressed;
  }
  if (keycode == 0xffb8) {
    this->_is_keyPAD8 = is_pressed;
  }
  if (keycode == 0xffb9) {
    this->_is_keyPAD9 = is_pressed;
  }
  if (keycode == 0xffab) {
    this->_is_keyPADADD = is_pressed;
  }
  if (keycode == 0xffad) {
    this->_is_keyPADSUB = is_pressed;
  }
  if (keycode == 0xffaa) {
    this->_is_keyPADMUL = is_pressed;
  }
  if (keycode == 0xffaf) {
    this->_is_keyPADDIV = is_pressed;
  }
  if (is_pressed) {
    if (*this->_keys != 0) {
      memmove(this->_keys + 1,this->_keys,0x1fc);
    }
    *this->_keys = keycode;
    if (*this->_released_keys != 0) {
      memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
      *this->_released_keys = 0;
    }
  }
  else {
    if (*this->_keys != 0) {
      memmove(this->_keys + 1,this->_keys,0x1fc);
      *this->_keys = 0;
    }
    if (*this->_released_keys != 0) {
      memmove(this->_released_keys + 1,this->_released_keys,0x1fc);
    }
    *this->_released_keys = keycode;
  }
  this->_is_event = (bool)(-(keycode != 0) & 1);
  if (keycode != 0) {
    pXVar1 = cimg::X11_attr();
    pthread_cond_broadcast((pthread_cond_t *)&pXVar1->wait_event);
  }
  return this;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool is_pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = is_pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (is_pressed) {
        if (*_keys)
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      if (keycode) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }